

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

wchar_t (*) [6] __thiscall
fmt::v5::internal::
udl_formatter<wchar_t,(wchar_t)123,(wchar_t)125,(wchar_t)99,(wchar_t)123,(wchar_t)125>::operator()
          (udl_formatter<wchar_t,_L___,_L___,_L_c_,_L___,_L___> *this,wchar_t (*args) [3],
          int *args_1)

{
  int *in_RDX;
  wchar_t (*in_RSI) [3];
  wchar_t (*in_RDI) [6];
  bool invalid_format;
  wchar_t s [6];
  error_handler local_51;
  basic_string_view<wchar_t> local_50;
  undefined1 local_39;
  wchar_t local_38 [8];
  wchar_t (*format_str) [6];
  
  builtin_wcsncpy(local_38,L"{}c{}",6);
  format_str = in_RDI;
  basic_string_view<wchar_t>::basic_string_view(&local_50,local_38,5);
  error_handler::error_handler(&local_51);
  local_39 = do_check_format_string<wchar_t,fmt::v5::internal::error_handler,wchar_t[3],int>
                       (local_50.data_,local_50.size_,&local_51);
  format<wchar_t[6],wchar_t[3],int>(format_str,in_RSI,in_RDX);
  return in_RDI;
}

Assistant:

std::basic_string<Char> operator()(const Args &... args) const {
    FMT_CONSTEXPR_DECL Char s[] = {CHARS..., '\0'};
    FMT_CONSTEXPR_DECL bool invalid_format =
        do_check_format_string<Char, error_handler, Args...>(
          basic_string_view<Char>(s, sizeof...(CHARS)));
    (void)invalid_format;
    return format(s, args...);
  }